

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sort_api(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  int32_t ecount;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  secp256k1_pubkey *pks_ptr [2];
  secp256k1_pubkey pks [2];
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  secp256k1_context *in_stack_ffffffffffffff38;
  secp256k1_pubkey *in_stack_ffffffffffffff90;
  
  testutil_random_pubkey_test(in_stack_ffffffffffffff90);
  testutil_random_pubkey_test(in_stack_ffffffffffffff90);
  iVar4 = secp256k1_ec_pubkey_sort
                    (in_stack_ffffffffffffff38,
                     (secp256k1_pubkey **)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (size_t)in_stack_ffffffffffffff28);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x19fa,"test condition failed: secp256k1_ec_pubkey_sort(CTX, pks_ptr, 2) == 1");
    abort();
  }
  p_Var1 = (CTX->illegal_callback).fn;
  pvVar2 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(void *)0x14d727);
  iVar4 = secp256k1_ec_pubkey_sort
                    (in_stack_ffffffffffffff38,
                     (secp256k1_pubkey **)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (size_t)in_stack_ffffffffffffff28);
  psVar3 = CTX;
  if (iVar4 == 0) {
    (CTX->illegal_callback).fn = p_Var1;
    (psVar3->illegal_callback).data = pvVar2;
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x19fb,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x19fb,"test condition failed: (secp256k1_ec_pubkey_sort(CTX, ((void*)0), 2)) == 0");
  abort();
}

Assistant:

static void test_sort_api(void) {
    secp256k1_pubkey pks[2];
    const secp256k1_pubkey *pks_ptr[2];

    pks_ptr[0] = &pks[0];
    pks_ptr[1] = &pks[1];

    testutil_random_pubkey_test(&pks[0]);
    testutil_random_pubkey_test(&pks[1]);

    CHECK(secp256k1_ec_pubkey_sort(CTX, pks_ptr, 2) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_sort(CTX, NULL, 2));
    CHECK(secp256k1_ec_pubkey_sort(CTX, pks_ptr, 0) == 1);
    /* Test illegal public keys */
    memset(&pks[0], 0, sizeof(pks[0]));
    CHECK_ILLEGAL_VOID(CTX, CHECK(secp256k1_ec_pubkey_sort(CTX, pks_ptr, 2) == 1));
    memset(&pks[1], 0, sizeof(pks[1]));
    {
        int32_t ecount = 0;
        secp256k1_context_set_illegal_callback(CTX, counting_callback_fn, &ecount);
        CHECK(secp256k1_ec_pubkey_sort(CTX, pks_ptr, 2) == 1);
        CHECK(ecount == 2);
        secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    }
}